

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O2

int match1by1(Abc_Ntk_t *pNtk1,Vec_Ptr_t **nodesInLevel1,Vec_Int_t **iMatch1,Vec_Int_t **iDep1,
             Vec_Int_t *matchedInputs1,int *iGroup1,Vec_Int_t **oMatch1,int *oGroup1,
             Abc_Ntk_t *pNtk2,Vec_Ptr_t **nodesInLevel2,Vec_Int_t **iMatch2,Vec_Int_t **iDep2,
             Vec_Int_t *matchedInputs2,int *iGroup2,Vec_Int_t **oMatch2,int *oGroup2,
             Vec_Int_t *matchedOutputs1,Vec_Int_t *matchedOutputs2,Vec_Int_t *oMatchedGroups,
             Vec_Int_t *iNonSingleton,int ii,int idx)

{
  long lVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Vec_Int_t *p;
  Vec_Ptr_t *pVVar8;
  void *__ptr;
  Abc_Ntk_t *pNtk;
  Vec_Int_t *pVVar9;
  Abc_Ntk_t *pNtk1_00;
  Abc_Obj_t *pAVar10;
  int *bitVector;
  int *bitVector_00;
  Vec_Int_t *currInputs;
  Vec_Int_t *currInputs_00;
  void *__ptr_00;
  Abc_Ntk_t *pAVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  int local_b8;
  Abc_Obj_t *local_68;
  ulong local_60;
  long local_58;
  Vec_Ptr_t *local_50;
  Abc_Ntk_t *local_48;
  ulong local_40;
  Abc_Ntk_t *local_38;
  
  while( true ) {
    match1by1_MATCH_FOUND = 0;
    if (ii == iNonSingleton->nSize) {
      match1by1_MATCH_FOUND = 1;
      return 1;
    }
    iVar3 = Vec_IntEntry(iNonSingleton,ii);
    if (iMatch1[iVar3]->nSize != idx) break;
    ii = ii + 1;
    idx = 0;
  }
  local_60 = (ulong)(uint)ii;
  p = Vec_IntAlloc(10);
  pVVar8 = Vec_PtrAlloc(100);
  pVVar9 = iMatch1[iVar3];
  uVar15 = pVVar9->nSize;
  __ptr = malloc((long)(int)uVar15 << 2);
  uVar14 = 0;
  uVar12 = 0;
  if (0 < (int)uVar15) {
    uVar12 = (ulong)uVar15;
  }
  for (; uVar12 != uVar14; uVar14 = uVar14 + 1) {
    *(undefined4 *)((long)__ptr + uVar14 * 4) = 0;
  }
  iVar4 = Vec_IntEntry(pVVar9,idx);
  Vec_IntPush(matchedInputs1,iVar4);
  local_58 = (long)idx;
  lVar1 = local_58 + 1;
  local_50 = pVVar8;
  if (idx == 0) {
    for (iVar4 = 0; pVVar8 = local_50, iVar5 = Vec_IntEntryLast(iMatch1[iVar3]),
        iVar4 < iDep1[iVar5]->nSize; iVar4 = iVar4 + 1) {
      iVar5 = Vec_IntEntryLast(iMatch1[iVar3]);
      iVar5 = Vec_IntEntry(iDep1[iVar5],iVar4);
      if (oMatch1[oGroup1[iVar5]]->nSize != 1) {
        iVar5 = Vec_IntEntryLast(iMatch1[iVar3]);
        iVar5 = Vec_IntEntry(iDep1[iVar5],iVar4);
        iVar5 = Vec_IntFind(oMatchedGroups,oGroup1[iVar5]);
        if (iVar5 == -1) {
          iVar5 = Vec_IntEntryLast(iMatch1[iVar3]);
          iVar5 = Vec_IntEntry(iDep1[iVar5],iVar4);
          Vec_IntPushUnique(p,oGroup1[iVar5]);
          iVar5 = Vec_IntEntryLast(iMatch1[iVar3]);
          iVar5 = Vec_IntEntry(iDep1[iVar5],iVar4);
          Vec_IntPushUnique(oMatchedGroups,oGroup1[iVar5]);
        }
      }
    }
  }
  pNtk = computeCofactor(pNtk1,nodesInLevel1,(int *)0x0,matchedInputs1);
  uVar15 = (uint)match1by1_MATCH_FOUND;
  local_40 = (ulong)(uint)idx;
  lVar16 = local_58;
  while ((lVar16 < iMatch2[iVar3]->nSize && ((uVar15 & 1) == 0))) {
    uVar15 = 0;
    if (*(int *)((long)__ptr + lVar16 * 4) == 0) {
      pVVar9 = Vec_IntAlloc(10);
      iVar5 = (int)lVar16;
      iVar4 = Vec_IntEntry(iMatch2[iVar3],iVar5);
      Vec_IntPush(matchedInputs2,iVar4);
      pNtk1_00 = computeCofactor(pNtk2,nodesInLevel2,(int *)0x0,matchedInputs2);
      for (; (int)uVar15 < matchedOutputs1->nSize; uVar15 = uVar15 + 1) {
        iVar4 = Vec_IntEntry(matchedOutputs1,uVar15);
        pAVar10 = Abc_NtkPo(pNtk,iVar4);
        Vec_PtrPush(pVVar8,pAVar10);
        iVar4 = Vec_IntEntry(matchedOutputs2,uVar15);
        pAVar10 = Abc_NtkPo(pNtk1_00,iVar4);
        Vec_PtrPush(pVVar8,pAVar10);
      }
      match1by1::counter = match1by1::counter + 1;
      iVar4 = Abc_NtkBmSat(pNtk1_00,pNtk,(Vec_Ptr_t *)0x0,pVVar8,pVVar9,0);
      local_b8 = (int)lVar1;
      if (iVar4 == 0) {
        bitVector = (int *)malloc((long)pNtk1->vPis->nSize << 2);
        bitVector_00 = (int *)malloc((long)pNtk2->vPis->nSize << 2);
        currInputs = Vec_IntAlloc(10);
        currInputs_00 = Vec_IntAlloc(10);
        pVVar2 = iMatch2[iVar3];
        __ptr_00 = malloc((long)(pVVar2->nSize - idx) << 2);
        pVVar8 = pNtk1->vPis;
        for (lVar13 = 0; lVar13 < pVVar8->nSize; lVar13 = lVar13 + 1) {
          bitVector[lVar13] = 0;
          bitVector_00[lVar13] = 0;
        }
        iVar4 = pVVar2->nSize;
        for (lVar13 = 0; lVar13 <= iVar4 - lVar1; lVar13 = lVar13 + 1) {
          *(undefined4 *)((long)__ptr_00 + lVar13 * 4) = 0;
        }
        for (iVar4 = 0; uVar15 = idx, iVar4 < pVVar9->nSize; iVar4 = iVar4 + 2) {
          iVar5 = Vec_IntEntry(pVVar9,iVar4);
          iVar7 = Vec_IntEntry(pVVar9,iVar4 + 1);
          iVar6 = Vec_IntEntry(matchedInputs1,iVar5);
          bitVector[iVar6] = iVar7;
          iVar7 = Vec_IntEntry(pVVar9,iVar4 + 1);
          iVar5 = Vec_IntEntry(matchedInputs2,iVar5);
          bitVector_00[iVar5] = iVar7;
        }
        for (; (int)uVar15 < iMatch1[iVar3]->nSize; uVar15 = uVar15 + 1) {
          iVar4 = Vec_IntEntry(iMatch1[iVar3],uVar15);
          Vec_IntPush(currInputs,iVar4);
          iVar4 = Vec_IntEntry(iMatch2[iVar3],uVar15);
          Vec_IntPush(currInputs_00,iVar4);
        }
        for (iVar4 = 0; iVar4 < pNtk1->vPis->nSize; iVar4 = iVar4 + 1) {
          iVar5 = Vec_IntFind(matchedInputs1,iVar4);
          if (iVar5 == -1) {
            Vec_IntPushUnique(currInputs,iVar4);
          }
          iVar5 = Vec_IntFind(matchedInputs2,iVar4);
          if (iVar5 == -1) {
            Vec_IntPushUnique(currInputs_00,iVar4);
          }
        }
        pAVar11 = computeCofactor(pNtk1,nodesInLevel1,bitVector,currInputs);
        local_38 = computeCofactor(pNtk2,nodesInLevel2,bitVector_00,currInputs_00);
        iVar4 = 0;
        local_48 = pAVar11;
        for (iVar5 = 0; pAVar11 = local_48, iVar5 < local_48->vPos->nSize; iVar5 = iVar5 + 1) {
          local_68 = Abc_NtkPo(local_48,iVar5);
          pVVar8 = Abc_NtkNodeSupport(pAVar11,&local_68,1);
          uVar15 = pVVar8->nSize;
          if (pVVar8->nSize < 1) {
            uVar15 = 0;
          }
          for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
            if (*(int *)((long)pVVar8->pArray[uVar12] + 0x10) == 1) {
              iVar7 = Vec_IntFind(matchedOutputs1,iVar5);
              iVar4 = iVar4 + iVar7 + 1;
            }
          }
          Vec_PtrFree(pVVar8);
        }
        for (iVar5 = 0; pAVar11 = local_38, pVVar8 = local_50, iVar5 < local_38->vPos->nSize;
            iVar5 = iVar5 + 1) {
          local_68 = Abc_NtkPo(local_38,iVar5);
          pVVar8 = Abc_NtkNodeSupport(pAVar11,&local_68,1);
          uVar15 = pVVar8->nSize;
          if (pVVar8->nSize < 1) {
            uVar15 = 0;
          }
          for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
            iVar7 = *(int *)((long)pVVar8->pArray[uVar12] + 0x10);
            lVar13 = (long)iVar7;
            if ((0 < lVar13) && (iVar7 <= iMatch2[iVar3]->nSize - idx)) {
              iVar7 = Vec_IntFind(matchedOutputs2,iVar5);
              *(int *)((long)__ptr_00 + lVar13 * 4 + -4) =
                   iVar7 + *(int *)((long)__ptr_00 + lVar13 * 4 + -4) + 1;
            }
          }
          Vec_PtrFree(pVVar8);
        }
        iVar5 = iMatch2[iVar3]->nSize;
        for (lVar13 = 0; lVar13 <= (long)iVar5 - (long)local_b8; lVar13 = lVar13 + 1) {
          if (*(int *)((long)__ptr_00 + lVar13 * 4) != iVar4) {
            *(undefined4 *)((long)__ptr + (long)((int)local_40 + (int)lVar13) * 4) = 1;
          }
        }
        Abc_NtkDelete(local_48);
        Abc_NtkDelete(pAVar11);
        free(bitVector);
        free(bitVector_00);
        Vec_IntFree(currInputs);
        Vec_IntFree(currInputs_00);
        free(__ptr_00);
      }
      else if (lVar16 == local_58) {
        matchNonSingletonOutputs
                  (pNtk1,nodesInLevel1,iMatch1,iDep1,matchedInputs1,iGroup1,oMatch1,oGroup1,pNtk2,
                   nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,oMatch2,oGroup2,
                   matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,pNtk,pNtk1_00,pVVar8
                   ,p,0,0,(int)local_60,local_b8);
      }
      else {
        iVar4 = Vec_IntEntry(iMatch2[iVar3],idx);
        pVVar2 = iMatch2[iVar3];
        iVar7 = Vec_IntEntry(pVVar2,iVar5);
        Vec_IntWriteEntry(pVVar2,idx,iVar7);
        Vec_IntWriteEntry(iMatch2[iVar3],iVar5,iVar4);
        matchNonSingletonOutputs
                  (pNtk1,nodesInLevel1,iMatch1,iDep1,matchedInputs1,iGroup1,oMatch1,oGroup1,pNtk2,
                   nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,oMatch2,oGroup2,
                   matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,pNtk,pNtk1_00,pVVar8
                   ,p,0,0,(int)local_60,local_b8);
        iVar4 = Vec_IntEntry(iMatch2[iVar3],idx);
        pVVar2 = iMatch2[iVar3];
        iVar7 = Vec_IntEntry(pVVar2,iVar5);
        Vec_IntWriteEntry(pVVar2,idx,iVar7);
        Vec_IntWriteEntry(iMatch2[iVar3],iVar5,iVar4);
      }
      pVVar8->nSize = 0;
      Abc_NtkDelete(pNtk1_00);
      Vec_IntFree(pVVar9);
      uVar15 = 1;
      if (match1by1_MATCH_FOUND == 0) {
        Vec_IntPop(matchedInputs2);
        uVar15 = (uint)match1by1_MATCH_FOUND;
      }
    }
    lVar16 = lVar16 + 1;
  }
  if (((uVar15 & 1) == 0) && (Vec_IntPop(matchedInputs1), idx == 0)) {
    for (iVar3 = 0; iVar3 < p->nSize; iVar3 = iVar3 + 1) {
      Vec_IntPop(oMatchedGroups);
    }
  }
  Vec_IntFree(p);
  Vec_PtrFree(pVVar8);
  free(__ptr);
  Abc_NtkDelete(pNtk);
  if (match1by1_MATCH_FOUND != 1) {
    return (uint)match1by1_MATCH_FOUND;
  }
  if (match1by1::counter == 0) {
    return 1;
  }
  match1by1::counter = 0;
  return 1;
}

Assistant:

int match1by1(Abc_Ntk_t * pNtk1, Vec_Ptr_t ** nodesInLevel1, Vec_Int_t ** iMatch1, Vec_Int_t ** iDep1, Vec_Int_t * matchedInputs1, int * iGroup1, Vec_Int_t ** oMatch1, int * oGroup1,
               Abc_Ntk_t * pNtk2, Vec_Ptr_t ** nodesInLevel2, Vec_Int_t ** iMatch2, Vec_Int_t ** iDep2, Vec_Int_t * matchedInputs2, int * iGroup2, Vec_Int_t ** oMatch2, int * oGroup2,
               Vec_Int_t * matchedOutputs1, Vec_Int_t * matchedOutputs2, Vec_Int_t * oMatchedGroups, Vec_Int_t * iNonSingleton, int ii, int idx)
{
    static int MATCH_FOUND = FALSE;
    Abc_Ntk_t * subNtk1, * subNtk2;
    Vec_Int_t * oNonSingleton;    
    Vec_Ptr_t * oMatchPairs;
    int * skipList;
    int j, m;    
    int i;        
    static int counter = 0;

    MATCH_FOUND = FALSE;

    if( ii == Vec_IntSize(iNonSingleton) )
    {
        MATCH_FOUND = TRUE;
        return TRUE;
    }
    
    i = Vec_IntEntry(iNonSingleton, ii);

    if( idx == Vec_IntSize(iMatch1[i]) )
    {        
        // call again with the next element in iNonSingleton
        return match1by1(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                         pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                         matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton, ii+1, 0);            
        
    }    
    
    oNonSingleton = Vec_IntAlloc(10);
    oMatchPairs = Vec_PtrAlloc(100);    
    skipList = ABC_ALLOC(int, Vec_IntSize(iMatch1[i]));

    for(j = 0; j < Vec_IntSize(iMatch1[i]); j++)
        skipList[j] = FALSE;
    
    Vec_IntPush(matchedInputs1, Vec_IntEntry(iMatch1[i], idx));
    idx++;
    
    if(idx == 1)
    {
        for(j = 0; j < Vec_IntSize(iDep1[Vec_IntEntryLast(iMatch1[i])]); j++)
        {
            if( Vec_IntSize(oMatch1[oGroup1[Vec_IntEntry(iDep1[Vec_IntEntryLast(iMatch1[i])], j)]]) == 1 ) 
                continue;
            if( Vec_IntFind( oMatchedGroups, oGroup1[Vec_IntEntry(iDep1[Vec_IntEntryLast(iMatch1[i])], j)]) != -1)
                continue;
            
            Vec_IntPushUnique(oNonSingleton,  oGroup1[Vec_IntEntry(iDep1[Vec_IntEntryLast(iMatch1[i])], j)]);
            Vec_IntPushUnique(oMatchedGroups, oGroup1[Vec_IntEntry(iDep1[Vec_IntEntryLast(iMatch1[i])], j)]);        
        }
    }

    subNtk1 = computeCofactor(pNtk1, nodesInLevel1, NULL, matchedInputs1);

    for(j = idx-1; j < Vec_IntSize(iMatch2[i]) && MATCH_FOUND == FALSE; j++)
    {
        int tempJ;
        Vec_Int_t * mismatch;

        if( skipList[j] )
            continue;

        mismatch = Vec_IntAlloc(10);

        Vec_IntPush(matchedInputs2, Vec_IntEntry(iMatch2[i], j));        
        
        subNtk2 = computeCofactor(pNtk2, nodesInLevel2, NULL, matchedInputs2);            

        for(m = 0; m < Vec_IntSize(matchedOutputs1); m++)
        {
            Vec_PtrPush(oMatchPairs, Abc_NtkPo(subNtk1, Vec_IntEntry(matchedOutputs1, m)));
            Vec_PtrPush(oMatchPairs, Abc_NtkPo(subNtk2, Vec_IntEntry(matchedOutputs2, m)));
        }

        counter++;

        if( Abc_NtkBmSat( subNtk2, subNtk1, NULL, oMatchPairs, mismatch, 0) )                
        {
            if(idx-1 != j)
            {
                tempJ = Vec_IntEntry(iMatch2[i], idx-1);
                Vec_IntWriteEntry(iMatch2[i], idx-1, Vec_IntEntry(iMatch2[i], j));
                Vec_IntWriteEntry(iMatch2[i], j, tempJ);
            }

            /*fprintf(matchFile, "%s matched to %s\n", Abc_ObjName(Abc_NtkPi(pNtk1, Vec_IntEntry(iMatch1[i], idx-1))), 
                                                      Abc_ObjName(Abc_NtkPi(pNtk2, Vec_IntEntry(iMatch2[i], j))));*/

            // we look for a match for outputs in oNonSingleton                                
            matchNonSingletonOutputs(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                                     pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                                     matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton,                         
                                     subNtk1, subNtk2, oMatchPairs, oNonSingleton, 0, 0, ii, idx);
            
            
            if(idx-1 != j)
            {
                tempJ = Vec_IntEntry(iMatch2[i], idx-1);
                Vec_IntWriteEntry(iMatch2[i], idx-1, Vec_IntEntry(iMatch2[i], j));
                Vec_IntWriteEntry(iMatch2[i], j, tempJ);
            }
        }
        else
        {
            Abc_Ntk_t * FpNtk1, * FpNtk2;
            int * bitVector1, * bitVector2;
            Vec_Int_t * currInputs1, * currInputs2;            
            Vec_Ptr_t * vSupp;    
            Abc_Obj_t * pObj;
            int suppNum1 = 0;
            int * suppNum2;            
            
            bitVector1 = ABC_ALLOC( int, Abc_NtkPiNum(pNtk1) );
            bitVector2 = ABC_ALLOC( int, Abc_NtkPiNum(pNtk2) );

            currInputs1 = Vec_IntAlloc(10);
            currInputs2 = Vec_IntAlloc(10);        
            
            suppNum2 = ABC_ALLOC(int, Vec_IntSize(iMatch2[i])-idx+1);

            for(m = 0; m < Abc_NtkPiNum(pNtk1); m++)
            {
                bitVector1[m] = 0;
                bitVector2[m] = 0;
            }

            for(m = 0; m < Vec_IntSize(iMatch2[i])-idx+1; m++)                        
                suppNum2[m]= 0;            

            // First of all set the value of the inputs that are already matched and are in mismatch
            for(m = 0; m < Vec_IntSize(mismatch); m += 2)
            {
                int n = Vec_IntEntry(mismatch, m);
                    
                bitVector1[Vec_IntEntry(matchedInputs1, n)] = Vec_IntEntry(mismatch, m+1);
                bitVector2[Vec_IntEntry(matchedInputs2, n)] = Vec_IntEntry(mismatch, m+1);
                
            }
            
            for(m = idx-1; m < Vec_IntSize(iMatch1[i]); m++)
            {
                Vec_IntPush(currInputs1, Vec_IntEntry(iMatch1[i], m));
                Vec_IntPush(currInputs2, Vec_IntEntry(iMatch2[i], m));
            }

            // Then add all the inputs that are not yet matched to the currInputs
            for(m = 0; m < Abc_NtkPiNum(pNtk1); m++)
            {
                if(Vec_IntFind( matchedInputs1, m ) == -1)
                    Vec_IntPushUnique(currInputs1, m);

                if(Vec_IntFind( matchedInputs2, m ) == -1)
                    Vec_IntPushUnique(currInputs2, m);
            }

            FpNtk1 = computeCofactor(pNtk1, nodesInLevel1, bitVector1, currInputs1);            
            FpNtk2 = computeCofactor(pNtk2, nodesInLevel2, bitVector2, currInputs2);    

            Abc_NtkForEachPo( FpNtk1, pObj, m )
            {        
                int n;
                vSupp  = Abc_NtkNodeSupport( FpNtk1, &pObj, 1 );                        
                
                for(n = 0; n < vSupp->nSize; n++)
                    if( Abc_ObjId((Abc_Obj_t *)vSupp->pArray[n]) == 1 )
                        suppNum1 += Vec_IntFind( matchedOutputs1, m) + 1;                
                        
                Vec_PtrFree( vSupp );
            }
            
            Abc_NtkForEachPo( FpNtk2, pObj, m )
            {        
                int n;
                vSupp  = Abc_NtkNodeSupport( FpNtk2, &pObj, 1 );                        
                
                for(n = 0; n < vSupp->nSize; n++)
                    if( (int)Abc_ObjId((Abc_Obj_t *)vSupp->pArray[n])-1 < (Vec_IntSize(iMatch2[i]))-idx+1 &&
                        (int)Abc_ObjId((Abc_Obj_t *)vSupp->pArray[n])-1 >= 0)
                        suppNum2[Abc_ObjId((Abc_Obj_t *)vSupp->pArray[n])-1] += Vec_IntFind( matchedOutputs2, m) + 1;                
                        
                Vec_PtrFree( vSupp );
            }

            /*if(suppNum1 != 0)            
                printf("Ntk1 is trigged");            

            if(suppNum2[0] != 0)
                printf("Ntk2 is trigged");*/

            for(m = 0; m < Vec_IntSize(iMatch2[i])-idx+1; m++)
                if(suppNum2[m] != suppNum1)
                {
                    skipList[m+idx-1] = TRUE;                    
                    /*printf("input is skipped");*/
                }
                
            Abc_NtkDelete( FpNtk1 );
            Abc_NtkDelete( FpNtk2 );
            ABC_FREE( bitVector1 );    
             ABC_FREE( bitVector2 );    
            Vec_IntFree( currInputs1 );
            Vec_IntFree( currInputs2 );            
            ABC_FREE( suppNum2 );
        }
        
        Vec_PtrClear(oMatchPairs);
        Abc_NtkDelete( subNtk2 );
        Vec_IntFree(mismatch);

        //Vec_IntWriteEntry(iMatch2[i], j, tempJ);        
        
        if( MATCH_FOUND == FALSE )
            Vec_IntPop(matchedInputs2);
    }

    if( MATCH_FOUND == FALSE )
    {
        Vec_IntPop(matchedInputs1);    
        
        if(idx == 1)
        {
            for(m = 0; m < Vec_IntSize(oNonSingleton); m++)
                Vec_IntPop( oMatchedGroups );
        }
    }
    
    Vec_IntFree( oNonSingleton );    
    Vec_PtrFree( oMatchPairs );    
    ABC_FREE( skipList );
    Abc_NtkDelete( subNtk1 );    

    if(MATCH_FOUND && counter != 0)
    {        
        /*printf("Number of INPUT SAT instances = %d\n", counter);*/

        counter = 0;
    }

    return MATCH_FOUND;
}